

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transmitter_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Transmitter_PDU::SetModulationParameters(Transmitter_PDU *this,KOCTET *MP,KUINT8 Length)

{
  KUINT16 *pKVar1;
  pointer *ppcVar2;
  pointer pcVar3;
  pointer pcVar4;
  iterator __position;
  byte bVar5;
  KUINT8 KVar6;
  char local_29;
  
  pcVar3 = (this->m_vModulationParams).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar4 = (this->m_vModulationParams).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pKVar1 = &(this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + ((short)pcVar3 - (short)pcVar4);
  if (pcVar3 != pcVar4) {
    (this->m_vModulationParams).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar3;
  }
  if (Length != '\0') {
    KVar6 = Length;
    do {
      __position._M_current =
           (this->m_vModulationParams).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_vModulationParams).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                  ((vector<char,std::allocator<char>> *)&this->m_vModulationParams,__position,MP);
      }
      else {
        *__position._M_current = *MP;
        ppcVar2 = &(this->m_vModulationParams).super__Vector_base<char,_std::allocator<char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppcVar2 = *ppcVar2 + 1;
      }
      MP = MP + 1;
      KVar6 = KVar6 + 0xff;
    } while (KVar6 != '\0');
    if ((Length & 7) != 0) {
      bVar5 = 0;
      do {
        local_29 = '\0';
        std::vector<char,_std::allocator<char>_>::emplace_back<char>
                  (&this->m_vModulationParams,&local_29);
        bVar5 = bVar5 + 1;
      } while (bVar5 < (byte)(8 - (Length & 7)));
    }
  }
  bVar5 = (char)(this->m_vModulationParams).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (char)(this->m_vModulationParams).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  this->m_ui8LengthOfModulationParam = bVar5;
  pKVar1 = &(this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + (ushort)bVar5;
  return;
}

Assistant:

void Transmitter_PDU::SetModulationParameters( const KOCTET * MP, KUINT8 Length )
{
    // If we already have data clear it first.
    m_ui16PDULength -= m_vModulationParams.size();
    m_vModulationParams.clear();

    // Copy data into the vector
    for( KUINT8 i = 0; i < Length; ++i, ++MP )
    {
        m_vModulationParams.push_back( *MP );
    }

    // Check if we need to add any padding, the length should be a
    // multiple of 8.
    KUINT8 ui8PaddingNeeded = ( Length % 8 == 0 ? 0 : ( 8 - Length % 8 ) );

    // Add the padding, if needed.
    for( KUINT8 i = 0; i < ui8PaddingNeeded; ++ i )
    {
        m_vModulationParams.push_back( 0 );
    }

    // Update length
    m_ui8LengthOfModulationParam = m_vModulationParams.size();
    m_ui16PDULength += m_ui8LengthOfModulationParam;
}